

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_tri_qua_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  REF_INT RVar15;
  REF_INT cell;
  REF_INT local [27];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    pcVar12 = "create";
    uVar7 = 0x1f7;
    goto LAB_00118856;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar10 = ref_mpi->n;
  iVar5 = ref_mpi->id;
  iVar8 = 0;
  iVar4 = (int)(4 / (long)iVar10);
  iVar13 = iVar4 * iVar10;
  if (4 < iVar13) {
    iVar8 = ((((iVar10 + 4) / iVar10) * (iVar13 + -5)) / iVar4 - iVar13) + 5;
  }
  if (iVar5 == iVar8) {
LAB_00117f7e:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x207;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,1,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x208;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,2,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x209;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar7 = 0x20b;
      goto LAB_00118856;
    }
    iVar10 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar4 = (int)(4 / (long)iVar10);
    iVar13 = iVar4 * iVar10;
  }
  else {
    iVar9 = (iVar10 + 4) / iVar10;
    iVar8 = 0;
    if (iVar9 + 1U < 3) {
      iVar8 = iVar9;
    }
    iVar14 = 5 - iVar13;
    if (iVar14 <= iVar8) {
      iVar8 = (1 - iVar9 * iVar14) / iVar4 + iVar14;
    }
    if (iVar5 == iVar8) goto LAB_00117f7e;
    iVar8 = (int)(2 / (long)iVar9);
    if (iVar14 <= iVar8) {
      iVar8 = (2 - iVar9 * iVar14) / iVar4 + iVar14;
    }
    if (iVar5 == iVar8) goto LAB_00117f7e;
  }
  iVar8 = 0;
  if (4 < iVar13) {
    iVar8 = ((((iVar10 + 4) / iVar10) * (iVar13 + -5)) / iVar4 - iVar13) + 5;
  }
  if (iVar5 == iVar8) {
LAB_001183a8:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x21b;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    lVar6 = -1;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,4,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x21c;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf] = -1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,3,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x21d;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = -1.0;
    pRVar2[1] = 1.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,1,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar7 = 0x21e;
      goto LAB_00118856;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar10 = ref_mpi->n;
    iVar5 = (iVar10 + 4) / iVar10;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar4 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar4;
      RVar15 = iVar10 + (int)((lVar6 - iVar5 * iVar10) / (long)iVar4);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[6],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar7 = 0x220;
      goto LAB_00118856;
    }
  }
  else {
    iVar10 = (iVar10 + 4) / iVar10;
    iVar8 = (int)(4 / (long)iVar10);
    iVar13 = 5 - iVar13;
    if (iVar13 <= iVar8) {
      iVar8 = (4 - iVar10 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar8) goto LAB_001183a8;
    iVar8 = (int)(3 / (long)iVar10);
    if (iVar13 <= iVar8) {
      iVar8 = (3 - iVar10 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar8) goto LAB_001183a8;
    iVar8 = 0;
    if (iVar10 + 1U < 3) {
      iVar8 = iVar10;
    }
    if (iVar13 <= iVar8) {
      iVar8 = (1 - iVar10 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar8) goto LAB_001183a8;
  }
  uVar3 = ref_node_initialize_n_global(ref_node,5);
  if (uVar3 == 0) {
    return 0;
  }
  pcVar12 = "init glob";
  uVar7 = 0x223;
LAB_00118856:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_tri_qua_grid",(ulong)uVar3,pcVar12);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_qua_grid(REF_GRID *ref_grid_ptr,
                                            REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 5;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 4;
  global[2] = 3;
  global[3] = 1;
  global[4] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, -1.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}